

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O0

int32_t helicsDataBufferFillFromComplexVector(HelicsDataBuffer data,double *value,int dataSize)

{
  SmallBuffer *this;
  size_t sVar1;
  bad_alloc *anon_var_0;
  SmallBuffer *ptr;
  SmallBuffer *in_stack_ffffffffffffffc0;
  HelicsDataBuffer in_stack_ffffffffffffffc8;
  complex<double> *in_stack_ffffffffffffffd0;
  undefined4 local_4;
  
  this = getBuffer(in_stack_ffffffffffffffc8);
  if (this == (SmallBuffer *)0x0) {
    local_4 = 0;
  }
  else {
    helics::ValueConverter<std::complex<double>_>::convert
              (in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0
              );
    sVar1 = helics::SmallBuffer::size(this);
    local_4 = (int32_t)sVar1;
  }
  return local_4;
}

Assistant:

int32_t helicsDataBufferFillFromComplexVector(HelicsDataBuffer data, const double* value, int dataSize)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return 0;
    }
    try {
        helics::ValueConverter<std::complex<double>>::convert(reinterpret_cast<const std::complex<double>*>(value), dataSize, *ptr);
        return static_cast<int32_t>(ptr->size());
    }
    catch (const std::bad_alloc&) {
        return 0;
    }
}